

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_import(lysp_ctx *ctx,lysp_stmt *stmt,lysp_import **imports)

{
  ly_stmt stmt_00;
  lysp_import *plVar1;
  LY_ERR LVar2;
  long *plVar3;
  char *pcVar4;
  char *pcVar5;
  uint32_t substmt_index;
  ly_ctx *plVar6;
  long lVar7;
  yang_arg arg;
  lysp_ext_instance **in_R9;
  lysp_stmt *stmt_01;
  char *str;
  char *local_48;
  long *local_40;
  long *local_38;
  
  local_48 = (char *)0x0;
  plVar1 = *imports;
  if (plVar1 == (lysp_import *)0x0) {
    plVar3 = (long *)malloc(0x48);
    if (plVar3 == (long *)0x0) goto LAB_0016cb84;
    *plVar3 = 1;
    lVar7 = 1;
  }
  else {
    lVar7 = *(long *)(plVar1[-1].rev + 6) + 1;
    *(long *)(plVar1[-1].rev + 6) = lVar7;
    plVar3 = (long *)realloc(plVar1[-1].rev + 6,lVar7 * 0x40 | 8);
    if (plVar3 == (long *)0x0) {
      *(long *)((*imports)[-1].rev + 6) = *(long *)((*imports)[-1].rev + 6) + -1;
LAB_0016cb84:
      if (ctx == (lysp_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar6,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_import");
      return LY_EMEM;
    }
    lVar7 = *plVar3;
  }
  *imports = (lysp_import *)(plVar3 + 1);
  plVar3[lVar7 * 8 + -1] = 0;
  (plVar3 + lVar7 * 8 + -1)[1] = 0;
  plVar3[lVar7 * 8 + -3] = 0;
  (plVar3 + lVar7 * 8 + -3)[1] = 0;
  plVar3[lVar7 * 8 + -5] = 0;
  (plVar3 + lVar7 * 8 + -5)[1] = 0;
  plVar3[lVar7 * 8 + -7] = 0;
  (plVar3 + lVar7 * 8 + -7)[1] = 0;
  LVar2 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (LVar2 == LY_SUCCESS) {
    if (ctx == (lysp_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar2 = lydict_insert(plVar6,stmt->arg,0,(char **)(plVar3 + lVar7 * 8 + -6));
    if ((LVar2 == LY_SUCCESS) &&
       (stmt_01 = stmt->child, LVar2 = LY_SUCCESS, stmt_01 != (lysp_stmt *)0x0)) {
      pcVar4 = (char *)((long)plVar3 + lVar7 * 0x40 + -6);
      local_38 = plVar3 + lVar7 * 8 + -3;
      local_40 = plVar3 + lVar7 * 8 + -4;
      do {
        stmt_00 = stmt_01->kw;
        arg = (yang_arg)(plVar3 + lVar7 * 8 + -2);
        if ((int)stmt_00 < 0x240000) {
          if (stmt_00 == LY_STMT_DESCRIPTION) {
            substmt_index = (uint32_t)local_40;
LAB_0016ccd1:
            LVar2 = lysp_stmt_text_field(ctx,stmt_01,substmt_index,(char **)0x2,arg,in_R9);
          }
          else {
            if (stmt_00 != LY_STMT_EXTENSION_INSTANCE) {
LAB_0016cd71:
              if (ctx == (lysp_ctx *)0x0) {
                plVar6 = (ly_ctx *)0x0;
              }
              else {
                plVar6 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar4 = lyplg_ext_stmt2str(stmt_00);
              pcVar5 = lyplg_ext_stmt2str(LY_STMT_IMPORT);
              ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,pcVar5);
              return LY_EVALID;
            }
            LVar2 = lysp_stmt_ext(ctx,stmt_01,stmt->kw,0,
                                  (lysp_ext_instance **)(plVar3 + lVar7 * 8 + -2));
          }
LAB_0016cd55:
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
        }
        else {
          if (stmt_00 == LY_STMT_REVISION_DATE) {
            LVar2 = lysp_stmt_text_field(ctx,stmt,(uint32_t)&local_48,(char **)0x2,arg,in_R9);
            pcVar5 = local_48;
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            strcpy(pcVar4,local_48);
            if (ctx == (lysp_ctx *)0x0) {
              plVar6 = (ly_ctx *)0x0;
            }
            else {
              plVar6 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            lydict_remove(plVar6,pcVar5);
            LVar2 = lysp_check_date(ctx,pcVar4,10,"revision-date");
            goto LAB_0016cd55;
          }
          if (stmt_00 == LY_STMT_REFERENCE) {
            substmt_index = (uint32_t)local_38;
            goto LAB_0016ccd1;
          }
          if (stmt_00 != LY_STMT_PREFIX) goto LAB_0016cd71;
          LVar2 = lysp_stmt_text_field
                            (ctx,stmt_01,(uint32_t)(plVar3 + lVar7 * 8 + -5),(char **)0x0,arg,in_R9)
          ;
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          LVar2 = lysp_check_prefix(ctx,*imports,(char *)0x0,(char **)(plVar3 + lVar7 * 8 + -5));
          if (LVar2 != LY_SUCCESS) {
            return LY_EVALID;
          }
        }
        stmt_01 = stmt_01->next;
        LVar2 = LY_SUCCESS;
      } while (stmt_01 != (lysp_stmt *)0x0);
    }
  }
  return LVar2;
}

Assistant:

static LY_ERR
lysp_stmt_import(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_import **imports)
{
    struct lysp_import *imp;
    const char *str = NULL;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *imports, imp, LY_EMEM);

    /* store name */
    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &imp->name));

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_PREFIX:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &imp->prefix, Y_IDENTIF_ARG, &imp->exts));
            LY_CHECK_RET(lysp_check_prefix(ctx, *imports, NULL, &imp->prefix), LY_EVALID);
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &imp->dsc, Y_STR_ARG, &imp->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &imp->ref, Y_STR_ARG, &imp->exts));
            break;
        case LY_STMT_REVISION_DATE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, stmt, 0, &str, Y_STR_ARG, &imp->exts));
            strcpy(imp->rev, str);
            lydict_remove(PARSER_CTX(ctx), str);
            LY_CHECK_RET(lysp_check_date(ctx, imp->rev, LY_REV_SIZE - 1, "revision-date"));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, &imp->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(LY_STMT_IMPORT));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}